

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter_impl.h
# Opt level: O0

void __thiscall spdlog::details::c_formatter::format(c_formatter *this,log_msg *msg,tm *tm_time)

{
  BasicWriter<char> *pBVar1;
  MemoryWriter *this_00;
  BasicStringRef<char> local_40;
  BasicStringRef<char> local_30;
  tm *local_20;
  tm *tm_time_local;
  log_msg *msg_local;
  c_formatter *this_local;
  
  local_20 = tm_time;
  tm_time_local = (tm *)msg;
  msg_local = (log_msg *)this;
  fmt::BasicStringRef<char>::BasicStringRef<std::allocator<char>>
            (&local_30,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (days_abi_cxx11_ + (long)tm_time->tm_wday * 0x20));
  pBVar1 = fmt::BasicWriter<char>::operator<<(&(msg->formatted).super_BasicWriter<char>,local_30);
  pBVar1 = fmt::BasicWriter<char>::operator<<(pBVar1,' ');
  fmt::BasicStringRef<char>::BasicStringRef<std::allocator<char>>
            (&local_40,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (months_abi_cxx11_ + (long)local_20->tm_mon * 0x20));
  pBVar1 = fmt::BasicWriter<char>::operator<<(pBVar1,local_40);
  pBVar1 = fmt::BasicWriter<char>::operator<<(pBVar1,' ');
  pBVar1 = fmt::BasicWriter<char>::operator<<(pBVar1,local_20->tm_mday);
  fmt::BasicWriter<char>::operator<<(pBVar1,' ');
  this_00 = pad_n_join((MemoryWriter *)&tm_time_local[10].tm_wday,local_20->tm_hour,local_20->tm_min
                       ,local_20->tm_sec,':');
  pBVar1 = fmt::BasicWriter<char>::operator<<(&this_00->super_BasicWriter<char>,' ');
  fmt::BasicWriter<char>::operator<<(pBVar1,local_20->tm_year + 0x76c);
  return;
}

Assistant:

void format(details::log_msg &msg, const std::tm &tm_time) override
    {
        msg.formatted << days[tm_time.tm_wday] << ' ' << months[tm_time.tm_mon] << ' ' << tm_time.tm_mday << ' ';
        pad_n_join(msg.formatted, tm_time.tm_hour, tm_time.tm_min, tm_time.tm_sec, ':') << ' ' << tm_time.tm_year + 1900;
    }